

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode tunnel_init(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict **pts)

{
  h1_tunnel_state_conflict *ts_00;
  CURLcode result;
  h1_tunnel_state_conflict *ts;
  h1_tunnel_state_conflict **pts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((cf->conn->handler->flags & 0x4000) == 0) {
    cf_local._4_4_ = Curl_get_upload_buffer(data);
    if (cf_local._4_4_ == CURLE_OK) {
      ts_00 = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0x120);
      if (ts_00 == (h1_tunnel_state_conflict *)0x0) {
        cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
          Curl_infof(data,"allocate connect buffer");
        }
        Curl_dyn_init(&ts_00->rcvbuf,0x4000);
        Curl_dyn_init(&ts_00->request_data,0x100000);
        Curl_httpchunk_init(data,&ts_00->ch,true);
        *pts = ts_00;
        Curl_conncontrol(cf->conn,0);
        cf_local._4_4_ = tunnel_reinit(cf,data,ts_00);
      }
    }
  }
  else {
    Curl_failf(data,"%s cannot be done over CONNECT",cf->conn->handler->scheme);
    cf_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode tunnel_init(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            struct h1_tunnel_state **pts)
{
  struct h1_tunnel_state *ts;
  CURLcode result;

  if(cf->conn->handler->flags & PROTOPT_NOTCPPROXY) {
    failf(data, "%s cannot be done over CONNECT", cf->conn->handler->scheme);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  /* we might need the upload buffer for streaming a partial request */
  result = Curl_get_upload_buffer(data);
  if(result)
    return result;

  ts = calloc(1, sizeof(*ts));
  if(!ts)
    return CURLE_OUT_OF_MEMORY;

  infof(data, "allocate connect buffer");

  Curl_dyn_init(&ts->rcvbuf, DYN_PROXY_CONNECT_HEADERS);
  Curl_dyn_init(&ts->request_data, DYN_HTTP_REQUEST);
  Curl_httpchunk_init(data, &ts->ch, TRUE);

  *pts =  ts;
  connkeep(cf->conn, "HTTP proxy CONNECT");
  return tunnel_reinit(cf, data, ts);
}